

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::reset_update_rate
          (raw_quasi_adaptive_huffman_data_model *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->m_update_cycle;
  uVar2 = (uVar1 - this->m_symbols_until_update) + this->m_total_count;
  this->m_total_count = uVar2;
  if (this->m_total_syms < uVar2) {
    rescale(this);
    uVar1 = this->m_update_cycle;
  }
  uVar2 = 8;
  if (uVar1 < 8) {
    uVar2 = uVar1;
  }
  this->m_update_cycle = uVar2;
  this->m_symbols_until_update = uVar2;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::reset_update_rate()
   {
      m_total_count += (m_update_cycle - m_symbols_until_update);

#ifdef _DEBUG
      uint actual_total = 0;
      for (uint i = 0; i < m_sym_freq.size(); i++)
         actual_total += m_sym_freq[i];
      LZHAM_ASSERT(actual_total == m_total_count);
#endif

      if (m_total_count > m_total_syms)
         rescale();

      m_symbols_until_update = m_update_cycle = LZHAM_MIN(8, m_update_cycle);
   }